

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsRoberts_dns_constraints.c
# Opt level: O1

int main(void)

{
  undefined8 *puVar1;
  sunrealtype *psVar2;
  uint uVar3;
  uint uVar4;
  N_Vector y;
  N_Vector p_Var5;
  long lVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  int iVar10;
  double dVar11;
  sunrealtype t_00;
  sunrealtype rtol;
  void *cvode_mem;
  SUNContext sunctx;
  int rootsfound [2];
  sunrealtype t;
  void *local_70;
  undefined8 local_68;
  uint local_60;
  uint local_5c;
  long local_58;
  long local_50;
  N_Vector local_48;
  double local_40;
  undefined8 local_38;
  
  local_70 = (void *)0x0;
  uVar3 = SUNContext_Create(0,&local_68);
  if ((int)uVar3 < 0) {
    pcVar9 = "SUNContext_Create";
  }
  else {
    y = (N_Vector)N_VNew_Serial(3,local_68);
    if (y == (N_Vector)0x0) {
      main_cold_6();
      return 1;
    }
    puVar1 = *(undefined8 **)((long)y->content + 0x10);
    *puVar1 = 0x3ff0000000000000;
    puVar1[1] = 0;
    puVar1[2] = 0;
    p_Var5 = (N_Vector)N_VNew_Serial(3,local_68);
    if (p_Var5 == (N_Vector)0x0) {
      main_cold_5();
      return 1;
    }
    puVar1 = *(undefined8 **)((long)p_Var5->content + 0x10);
    *puVar1 = 0x3eb0c6f7a0b5ed8d;
    puVar1[1] = 0x3da5fd7fe1796495;
    puVar1[2] = 0x3ee4f8b588e368f1;
    lVar6 = N_VNew_Serial(3,local_68);
    if (lVar6 == 0) {
      main_cold_4();
      return 1;
    }
    N_VConst(0x3ff0000000000000,lVar6);
    local_70 = (void *)CVodeCreate(2,local_68);
    if (local_70 == (void *)0x0) {
      main_cold_3();
      return 1;
    }
    uVar3 = CVodeInit(0,local_70,f,y);
    if ((int)uVar3 < 0) {
      pcVar9 = "CVodeInit";
    }
    else {
      uVar3 = CVodeSVtolerances(0x3f1a36e2eb1c432d,local_70,p_Var5);
      if ((int)uVar3 < 0) {
        pcVar9 = "CVodeSVtolerances";
      }
      else {
        uVar3 = CVodeRootInit(local_70,2,g);
        if ((int)uVar3 < 0) {
          pcVar9 = "CVodeRootInit";
        }
        else {
          lVar7 = SUNDenseMatrix(3,3,local_68);
          if (lVar7 == 0) {
            main_cold_2();
            return 1;
          }
          lVar8 = SUNLinSol_Dense(y,lVar7,local_68);
          if (lVar8 == 0) {
            main_cold_1();
            return 1;
          }
          uVar3 = CVodeSetLinearSolver(local_70,lVar8,lVar7);
          if ((int)uVar3 < 0) {
            pcVar9 = "CVodeSetLinearSolver";
          }
          else {
            uVar3 = CVodeSetJacFn(local_70,Jac);
            if ((int)uVar3 < 0) {
              pcVar9 = "CVodeSetJacFn";
            }
            else {
              uVar3 = CVodeSetConstraints(local_70,lVar6);
              if (-1 < (int)uVar3) {
                local_58 = lVar8;
                local_50 = lVar7;
                local_48 = p_Var5;
                N_VDestroy(lVar6);
                puts(" \n3-species kinetics problem\n");
                dVar11 = 0.4;
                iVar10 = 0;
                while( true ) {
                  local_40 = dVar11;
                  uVar4 = CVode(local_70,y,&local_38,1);
                  psVar2 = *(sunrealtype **)((long)y->content + 0x10);
                  rtol = *psVar2;
                  printf("At t = %0.4e      y =%14.6e  %14.6e  %14.6e\n",local_38,rtol,psVar2[1],
                         psVar2[2]);
                  if (uVar4 == 2) {
                    uVar3 = CVodeGetRootInfo(local_70,&local_60);
                    if ((int)uVar3 < 0) {
                      pcVar9 = "CVodeGetRootInfo";
                      goto LAB_001028de;
                    }
                    printf("    rootsfound[] = %3d %3d\n",(ulong)local_60,(ulong)local_5c);
                  }
                  if ((int)uVar4 < 0) break;
                  dVar11 = local_40 * 10.0;
                  if (uVar4 != 0) {
                    dVar11 = local_40;
                  }
                  iVar10 = iVar10 + (uint)(uVar4 == 0);
                  rtol = local_40;
                  if (iVar10 == 0xc) {
LAB_00102747:
                    PrintFinalStats(local_70);
                    p_Var5 = local_48;
                    iVar10 = check_ans(y,t_00,rtol,local_48);
                    N_VDestroy(y);
                    N_VDestroy(p_Var5);
                    CVodeFree(&local_70);
                    SUNLinSolFree(local_58);
                    SUNMatDestroy(local_50);
                    SUNContext_Free(&local_68);
                    return iVar10;
                  }
                }
                fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","CVode",
                        (ulong)uVar4);
                goto LAB_00102747;
              }
              pcVar9 = "CVodeSetConstraints";
            }
          }
        }
      }
    }
  }
LAB_001028de:
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar9,(ulong)uVar3);
  return 1;
}

Assistant:

int main(void)
{
  SUNContext sunctx;
  sunrealtype t, tout;
  N_Vector y;
  N_Vector abstol;
  N_Vector constraints;
  SUNMatrix A;
  SUNLinearSolver LS;
  void* cvode_mem;
  int retval, iout;
  int retvalr;
  int rootsfound[2];

  y           = NULL;
  abstol      = NULL;
  constraints = NULL;
  A           = NULL;
  LS          = NULL;
  cvode_mem   = NULL;

  /* Create the SUNDIALS context */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Initial conditions */
  y = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return (1); }

  /* Initialize y */
  Ith(y, 1) = Y1;
  Ith(y, 2) = Y2;
  Ith(y, 3) = Y3;

  /* Set the vector absolute tolerance */
  abstol = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)abstol, "N_VNew_Serial", 0)) { return (1); }

  Ith(abstol, 1) = ATOL1;
  Ith(abstol, 2) = ATOL2;
  Ith(abstol, 3) = ATOL3;

  /* Set constraints to all 1's for nonnegative solution values. */
  constraints = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)constraints, "N_VNew_Serial", 0)) { return (1); }

  N_VConst(ONE, constraints);

  /* Call CVodeCreate to create the solver memory and specify the
   * Backward Differentiation Formula */
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  /* Call CVodeInit to initialize the integrator memory and specify the
   * user's right hand side function in y'=f(t,y), the initial time T0, and
   * the initial dependent variable vector y. */
  retval = CVodeInit(cvode_mem, f, T0, y);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  /* Call CVodeSVtolerances to specify the scalar relative tolerance
   * and vector absolute tolerances */
  retval = CVodeSVtolerances(cvode_mem, RTOL, abstol);
  if (check_retval(&retval, "CVodeSVtolerances", 1)) { return (1); }

  /* Call CVodeRootInit to specify the root function g with 2 components */
  retval = CVodeRootInit(cvode_mem, 2, g);
  if (check_retval(&retval, "CVodeRootInit", 1)) { return (1); }

  /* Create dense SUNMatrix */
  A = SUNDenseMatrix(NEQ, NEQ, sunctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver */
  LS = SUNLinSol_Dense(y, A, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = CVodeSetLinearSolver(cvode_mem, LS, A);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return (1); }

  /* Set the user-supplied Jacobian routine Jac */
  retval = CVodeSetJacFn(cvode_mem, Jac);
  if (check_retval(&retval, "CVodeSetJacFn", 1)) { return (1); }

  /* Call CVodeSetConstraints to initialize constraints */
  retval = CVodeSetConstraints(cvode_mem, constraints);
  if (check_retval(&retval, "CVodeSetConstraints", 1)) { return (1); }
  N_VDestroy(constraints);

  /* In loop, call CVode, print results, and test for error.
     Break out of loop when NOUT preset output times have been reached.  */
  printf(" \n3-species kinetics problem\n\n");

  iout = 0;
  tout = T1;
  while (1)
  {
    retval = CVode(cvode_mem, tout, y, &t, CV_NORMAL);
    PrintOutput(t, Ith(y, 1), Ith(y, 2), Ith(y, 3));

    if (retval == CV_ROOT_RETURN)
    {
      retvalr = CVodeGetRootInfo(cvode_mem, rootsfound);
      if (check_retval(&retvalr, "CVodeGetRootInfo", 1)) { return (1); }
      PrintRootInfo(rootsfound[0], rootsfound[1]);
    }

    if (check_retval(&retval, "CVode", 1)) { break; }
    if (retval == CV_SUCCESS)
    {
      iout++;
      tout *= TMULT;
    }

    if (iout == NOUT) { break; }
  }

  /* Print some final statistics */
  PrintFinalStats(cvode_mem);

  /* check the solution error */
  retval = check_ans(y, t, RTOL, abstol);

  /* Free memory */
  N_VDestroy(y);            /* Free y vector */
  N_VDestroy(abstol);       /* Free abstol vector */
  CVodeFree(&cvode_mem);    /* Free CVODES memory */
  SUNLinSolFree(LS);        /* Free the linear solver memory */
  SUNMatDestroy(A);         /* Free the matrix memory */
  SUNContext_Free(&sunctx); /* Free the SUNDIALS context */

  return (retval);
}